

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog.h
# Opt level: O0

void spdlog::error<char_const*>(char **msg)

{
  logger *this;
  char **msg_local;
  
  this = default_logger_raw();
  logger::error<char_const*>(this,msg);
  return;
}

Assistant:

inline void error(const T &msg)
{
    default_logger_raw()->error(msg);
}